

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11Xcb.cpp
# Opt level: O0

void __thiscall
tcu::x11::XcbWindow::XcbWindow
          (XcbWindow *this,XcbDisplay *display,int width,int height,xcb_visualid_t *visual)

{
  xcb_window_t xVar1;
  xcb_colormap_t xVar2;
  undefined4 uVar3;
  xcb_connection_t *pxVar4;
  xcb_screen_t *pxVar5;
  void *ptr;
  xcb_alloc_color_reply_t *rep;
  uint32_t local_44 [2];
  uint32_t values [2];
  xcb_connection_t *connection;
  xcb_visualid_t *visual_local;
  int height_local;
  int width_local;
  XcbDisplay *display_local;
  XcbWindow *this_local;
  
  WindowBase::WindowBase(&this->super_WindowBase);
  (this->super_WindowBase)._vptr_WindowBase = (_func_int **)&PTR__XcbWindow_0066f218;
  this->m_display = display;
  pxVar4 = XcbDisplay::getConnection(this->m_display);
  xVar1 = xcb_generate_id(pxVar4);
  this->m_window = xVar1;
  xVar2 = xcb_generate_id(pxVar4);
  this->m_colormap = xVar2;
  connection = (xcb_connection_t *)visual;
  if (visual == (xcb_visualid_t *)0x0) {
    pxVar5 = XcbDisplay::getScreen(this->m_display);
    connection = (xcb_connection_t *)&pxVar5->root_visual;
  }
  pxVar5 = XcbDisplay::getScreen(this->m_display);
  local_44[0] = pxVar5->white_pixel;
  local_44[1] = 0x408000;
  xVar1 = this->m_window;
  pxVar5 = XcbDisplay::getScreen(display);
  xcb_create_window(pxVar4,0,xVar1,pxVar5->root,0,0,width & 0xffff,height & 0xffff,10,1,
                    *(undefined4 *)connection,0x802,local_44);
  xcb_create_colormap(pxVar4,0,this->m_colormap,this->m_window,*(undefined4 *)connection);
  uVar3 = xcb_alloc_color(pxVar4,this->m_colormap,0xffff,0);
  ptr = (void *)xcb_alloc_color_reply(pxVar4,uVar3,0);
  deFree(ptr);
  xcb_flush(pxVar4);
  return;
}

Assistant:

XcbWindow::XcbWindow (XcbDisplay& display, int width, int height, xcb_visualid_t* visual)
	: WindowBase	()
	, m_display		(display)
{
	xcb_connection_t*	connection = m_display.getConnection();
	uint32_t			values[2];
	m_window	= xcb_generate_id(connection);
	m_colormap	= xcb_generate_id(connection);

	if (visual == DE_NULL)
		visual = &m_display.getScreen()->root_visual;

	values[0] = m_display.getScreen()->white_pixel;
	values[1] = XCB_EVENT_MASK_EXPOSURE | XCB_EVENT_MASK_PROPERTY_CHANGE;

	xcb_create_window	(
							connection,								// Connection
							XCB_COPY_FROM_PARENT,					// depth (same as root)
							m_window,								// window Id
							display.getScreen()->root,				// parent window
							0, 0,									// x, y
							static_cast<uint16_t >(width),			// width
							static_cast<uint16_t >(height),			// height
							10,										// border_width
							XCB_WINDOW_CLASS_INPUT_OUTPUT,			// class
							*visual,								// visual
							XCB_CW_BACK_PIXEL | XCB_CW_EVENT_MASK,	// masks
							values									//not used yet
						);

	xcb_create_colormap	(
							connection,
							XCB_COLORMAP_ALLOC_NONE,
							m_colormap,
							m_window,
							*visual
						);

	xcb_alloc_color_reply_t* rep = xcb_alloc_color_reply(connection, xcb_alloc_color(connection, m_colormap, 65535, 0, 0), NULL);
	deFree(rep);
	xcb_flush (connection);
}